

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef *macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef *names)

{
  int iVar1;
  IResultCapture *pIVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char c;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  byte local_d1;
  Capturer *local_d0;
  OfType local_c4;
  StringRef *local_c0;
  _Deque_base<char,_std::allocator<char>_> local_b8;
  SourceLineInfo *local_60;
  StringRef *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c4 = resultType;
  local_c0 = macroName;
  pIVar2 = getResultCapture();
  this->m_resultCapture = pIVar2;
  this->m_captured = 0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  clara::std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_b8,0);
  if (names->m_size == 0) {
    uVar8 = 0;
  }
  else {
    lVar5 = 1;
    uVar3 = 0;
    uVar8 = 0;
    local_d0 = this;
    do {
      local_d1 = names->m_start[uVar3];
      if (local_d1 < 0x5b) {
        if (local_d1 == 0x28) goto LAB_001205a2;
        if (local_d1 != 0x29) {
          if (((local_d1 == 0x2c) && (uVar8 != uVar3)) &&
             (local_b8._M_impl.super__Deque_impl_data._M_start._M_last +
              (long)(local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur +
                    (((((ulong)((long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3)
                      - 1) + (ulong)(local_b8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                    (_Map_pointer)0x0)) * 0x200 -
                    (long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_first)) ==
              local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)) {
            std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
            emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                      ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,
                       local_c0,lineInfo,&local_c4);
            pcVar6 = names->m_start;
            lVar4 = lVar5 - uVar8;
            local_60 = lineInfo;
            while ((pcVar6[uVar8] == 0x2c || (iVar1 = isspace((int)pcVar6[uVar8]), iVar1 != 0))) {
              uVar8 = uVar8 + 1;
              lVar4 = lVar4 + -1;
            }
            pcVar7 = pcVar6 + uVar3;
            local_58 = names;
            while ((*pcVar7 == 0x2c || (iVar1 = isspace((int)*pcVar7), names = local_58, iVar1 != 0)
                   )) {
              lVar4 = lVar4 + -1;
              pcVar7 = pcVar7 + -1;
            }
            pcVar6 = pcVar6 + uVar8;
            if (local_58->m_size <= uVar8) {
              lVar4 = 0;
              pcVar6 = "";
            }
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,pcVar6,pcVar6 + lVar4);
            this = local_d0;
            std::__cxx11::string::operator=
                      ((string *)
                       &(local_d0->m_messages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)local_50);
            lineInfo = local_60;
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            std::__cxx11::string::append
                      ((char *)&(this->m_messages).
                                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].message);
            uVar8 = uVar3;
          }
          goto LAB_00120615;
        }
LAB_001205bd:
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
               (_Elt_pointer)
               ((byte *)local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x200);
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (_Elt_pointer)
               ((byte *)local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1ff);
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      else {
        if (local_d1 < 0x7b) {
          if (local_d1 != 0x5b) {
            if (local_d1 == 0x5d) goto LAB_001205bd;
            goto LAB_00120615;
          }
        }
        else {
          if (local_d1 == 0x7d) goto LAB_001205bd;
          if (local_d1 != 0x7b) goto LAB_00120615;
        }
LAB_001205a2:
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                    ((deque<char,std::allocator<char>> *)&local_b8,(char *)&local_d1);
        }
        else {
          *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_d1;
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
LAB_00120615:
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + 1;
    } while (uVar3 < names->m_size);
  }
  std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
  emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
            ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,local_c0,lineInfo
             ,&local_c4);
  pcVar6 = names->m_start;
  uVar3 = names->m_size;
  while ((pcVar6[uVar8] == 0x2c || (iVar1 = isspace((int)pcVar6[uVar8]), iVar1 != 0))) {
    uVar8 = uVar8 + 1;
  }
  pcVar7 = pcVar6 + uVar3;
  lVar5 = uVar3 - uVar8;
  while( true ) {
    pcVar7 = pcVar7 + -1;
    if ((*pcVar7 != 0x2c) && (iVar1 = isspace((int)*pcVar7), iVar1 == 0)) break;
    lVar5 = lVar5 + -1;
  }
  lVar4 = 0;
  if (uVar8 < uVar3) {
    lVar4 = lVar5;
  }
  pcVar7 = "";
  if (uVar8 < uVar3) {
    pcVar7 = pcVar6 + uVar8;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar7,pcVar7 + lVar4);
  std::__cxx11::string::operator=
            ((string *)
             &(this->m_messages).
              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].message,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__cxx11::string::append
            ((char *)&(this->m_messages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].message);
  clara::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_b8);
  return;
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(names[start])) {
                ++start;
            }
            while (names[end] == ',' || isspace(names[end])) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case ',':
                if (start != pos && openings.size() == 0) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = trimmed(start, pos);
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.size() == 0 && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = trimmed(start, names.size() - 1);
        m_messages.back().message += " := ";
    }